

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::Formattable(Formattable *this,Formattable *source)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003a2d88;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  init(this,(EVP_PKEY_CTX *)source);
  operator=(this,source);
  return;
}

Assistant:

Formattable::Formattable(const Formattable &source)
     :  UObject(*this)
{
    init();
    *this = source;
}